

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

iterator __thiscall
GF2::MI<6UL,_GF2::MOGrevlex<6UL>_>::Splice
          (MI<6UL,_GF2::MOGrevlex<6UL>_> *this,MI<6UL,_GF2::MOGrevlex<6UL>_> *iRight,iterator pos)

{
  bool bVar1;
  _List_node_base *in_RDX;
  __off64_t *in_RSI;
  iterator in_RDI;
  __off64_t *in_R8;
  size_t in_R9;
  iterator where;
  iterator *in_stack_00000058;
  MP<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_00000060;
  MI<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_00000068;
  uint in_stack_ffffffffffffffa8;
  MI<6UL,_GF2::MOGrevlex<6UL>_> *in_stack_ffffffffffffffb0;
  _List_const_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_> local_40;
  _List_const_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_> local_38 [2];
  _List_node_base *local_28;
  __off64_t *local_20;
  iterator local_10;
  _List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_> local_8;
  
  local_20 = in_RSI;
  local_10._M_node = in_RDX;
  std::_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::_List_iterator(&local_8);
  std::_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::operator*
            ((_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_> *)0x1c4581);
  bVar1 = Find(in_stack_00000068,in_stack_00000060,in_stack_00000058);
  if (bVar1) {
    local_28 = local_10._M_node;
    RemoveAt(in_stack_ffffffffffffffb0,in_RDI);
  }
  else {
    std::_List_const_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::_List_const_iterator
              (local_38,&local_8);
    std::_List_const_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::_List_const_iterator
              (&local_40,&local_10);
    std::__cxx11::
    list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>::
    splice((list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
            *)in_RDI._M_node,(int)local_38[0]._M_node,local_20,(int)local_40._M_node,in_R8,in_R9,
           in_stack_ffffffffffffffa8);
    std::_List_iterator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>::operator--(&local_8);
  }
  return (iterator)local_8._M_node;
}

Assistant:

iterator Splice(MI& iRight, iterator pos)
	{
		assert(IsConsistent(iRight));
		iterator where;
		if (Find(*pos, where))
			iRight.RemoveAt(pos);
		else
			splice(where, iRight, pos), --where;
		return where;
	}